

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int ffkshf(fitsfile *fptr,int colmin,int colmax,int incre,int *status)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  long lVar5;
  int nrec;
  int iVar6;
  int tstatus;
  int nkeys;
  long ivalue;
  int nmore;
  char rec [81];
  char q [75];
  char newkey [75];
  int local_168;
  int local_164;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  int local_13c;
  undefined4 local_138;
  uint local_d8 [20];
  char local_88 [88];
  
  ffghsp(fptr,&local_164,&local_13c,status);
  if (8 < local_164) {
    local_150 = (long)colmin;
    local_148 = (long)colmax;
    local_158 = (long)incre;
    nrec = 9;
    do {
      ffgrec(fptr,nrec,(char *)&local_138,status);
      iVar6 = nrec;
      if ((char)local_138 == 'T') {
        strncpy((char *)local_d8,(char *)((long)&local_138 + 1),4);
        uVar3 = 5;
        bVar2 = false;
        bVar1 = bVar2;
        if (0x4f524559 < (int)local_d8[0]) {
          if ((int)local_d8[0] < 0x544c4443) {
            if ((int)local_d8[0] < 0x50595443) {
              if ((local_d8[0] != 0x4f52455a) && (local_d8[0] != 0x50534944)) goto LAB_0011bef4;
            }
            else if ((local_d8[0] != 0x50595443) && (local_d8[0] != 0x54494e55)) goto LAB_0011bef4;
          }
          else if ((int)local_d8[0] < 0x58414d44) {
            if ((local_d8[0] != 0x544c4443) && (local_d8[0] != 0x544f5243)) goto LAB_0011bef4;
          }
          else if ((local_d8[0] != 0x58414d44) &&
                  ((local_d8[0] != 0x58414d4c && (local_d8[0] != 0x58505243)))) goto LAB_0011bef4;
          goto LAB_0011bf07;
        }
        if ((int)local_d8[0] < 0x4c4f4342) {
          if ((int)local_d8[0] < 0x4c414353) {
            if ((local_d8[0] != 0x45505954) && (local_d8[0] != 0x494e5543)) goto LAB_0011bef4;
          }
          else if ((local_d8[0] != 0x4c414353) && (local_d8[0] != 0x4c4c554e)) goto LAB_0011bef4;
        }
        else if ((int)local_d8[0] < 0x4d524f46) {
          if ((local_d8[0] != 0x4c4f4342) && (local_d8[0] != 0x4c565243)) goto LAB_0011bef4;
        }
        else {
          bVar1 = false;
          if ((local_d8[0] != 0x4d524f46) &&
             ((bVar1 = bVar2, local_d8[0] != 0x4e494d44 && (local_d8[0] != 0x4e494d4c)))) {
LAB_0011bef4:
            uVar3 = (uint)(local_138 == 0x4d494454) << 2;
            bVar1 = local_138 != 0x4d494454;
          }
        }
LAB_0011bf07:
        if (!bVar1) {
          local_d8[0] = local_d8[0] & 0xffffff00;
          strncat((char *)local_d8,(char *)((long)&local_138 + (ulong)uVar3),(ulong)(8 - uVar3));
          local_168 = 0;
          ffc2ii((char *)local_d8,&local_160,&local_168);
          if ((local_168 == 0) && (local_160 <= local_148 && local_150 <= local_160)) {
            if (local_160 == local_150 && incre < 1) {
              ffdrec(fptr,nrec,status);
              local_164 = local_164 + -1;
              iVar6 = nrec + -1;
            }
            else {
              lVar5 = local_160 + local_158;
              local_d8[0] = local_d8[0] & 0xffffff00;
              local_160 = lVar5;
              strncat((char *)local_d8,(char *)&local_138,(ulong)uVar3);
              ffkeyn((char *)local_d8,(int)lVar5,local_88,status);
              _local_138 = 0x2020202020202020;
              sVar4 = strlen(local_88);
              strncpy((char *)&local_138,local_88,(long)(int)sVar4);
              ffmrec(fptr,nrec,(char *)&local_138,status);
            }
          }
        }
      }
      nrec = iVar6 + 1;
    } while (iVar6 < local_164);
  }
  return *status;
}

Assistant:

int ffkshf(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colmin,      /* I - starting col. to be incremented; 1 = 1st */
           int colmax,      /* I - last column to be incremented            */
           int incre,       /* I - shift index number by this amount        */
           int *status)     /* IO - error status                            */
/*
  shift the index value on any existing column keywords
  This routine will modify the name of any keyword that begins with 'T'
  and has an index number in the range COLMIN - COLMAX, inclusive.

  if incre is positive, then the index values will be incremented.
  if incre is negative, then the kewords with index = COLMIN
  will be deleted and the index of higher numbered keywords will
  be decremented.
*/
{
    int nkeys, nmore, nrec, tstatus, i1;
    long ivalue;
    char rec[FLEN_CARD], q[FLEN_KEYWORD], newkey[FLEN_KEYWORD];

    ffghsp(fptr, &nkeys, &nmore, status);  /* get number of keywords */

    /* go thru header starting with the 9th keyword looking for 'TxxxxNNN' */

    for (nrec = 9; nrec <= nkeys; nrec++)
    {     
        ffgrec(fptr, nrec, rec, status);

        if (rec[0] == 'T')
        {
            i1 = 0;
            strncpy(q, &rec[1], 4);
            if (!strncmp(q, "BCOL", 4) || !strncmp(q, "FORM", 4) ||
                !strncmp(q, "TYPE", 4) || !strncmp(q, "SCAL", 4) ||
                !strncmp(q, "UNIT", 4) || !strncmp(q, "NULL", 4) ||
                !strncmp(q, "ZERO", 4) || !strncmp(q, "DISP", 4) ||
                !strncmp(q, "LMIN", 4) || !strncmp(q, "LMAX", 4) ||
                !strncmp(q, "DMIN", 4) || !strncmp(q, "DMAX", 4) ||
                !strncmp(q, "CTYP", 4) || !strncmp(q, "CRPX", 4) ||
                !strncmp(q, "CRVL", 4) || !strncmp(q, "CDLT", 4) ||
                !strncmp(q, "CROT", 4) || !strncmp(q, "CUNI", 4) )
              i1 = 5;
            else if (!strncmp(rec, "TDIM", 4) )
              i1 = 4;

            if (i1)
            {
              /* try reading the index number suffix */
              q[0] = '\0';
              strncat(q, &rec[i1], 8 - i1);

              tstatus = 0;
              ffc2ii(q, &ivalue, &tstatus);

              if (tstatus == 0 && ivalue >= colmin && ivalue <= colmax)
              {
                if (incre <= 0 && ivalue == colmin)       
                {
                  ffdrec(fptr, nrec, status); /* delete keyword */
                  nkeys = nkeys - 1;
                  nrec = nrec - 1;
                }
                else
                {
                  ivalue = ivalue + incre;
                  q[0] = '\0';
                  strncat(q, rec, i1);
     
                  ffkeyn(q, ivalue, newkey, status);
		  /* NOTE: because of null termination, it is not 
		     equivalent to use strcpy() for the same calls */
                  strncpy(rec, "        ", 8);    /* erase old keyword name */
                  i1 = strlen(newkey);
                  strncpy(rec, newkey, i1);   /* overwrite new keyword name */
                  ffmrec(fptr, nrec, rec, status);  /* modify the record */
                }
              }
            }
        }
    }
    return(*status);
}